

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

void icu_63::initLeapMonthPattern
               (UnicodeString *field,int32_t index,CalendarDataSink *sink,CharString *path,
               UErrorCode *status)

{
  ushort uVar1;
  ushort uVar2;
  Hashtable *this;
  UnicodeString *src;
  ConstChar16Ptr local_c0;
  char16_t *local_b8;
  UnicodeString leapLabel;
  UnicodeString pathUString;
  
  uVar1 = field[(uint)index].fUnion.fStackFields.fLengthAndFlags;
  uVar2 = 2;
  if ((uVar1 & 1) == 0) {
    uVar2 = uVar1 & 0x1e;
  }
  field[(uint)index].fUnion.fStackFields.fLengthAndFlags = uVar2;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeString::UnicodeString(&pathUString,(path->buffer).ptr,-1,kInvariant);
    this = (Hashtable *)Hashtable::get(&sink->maps,&pathUString);
    if (this == (Hashtable *)0x0) {
      *status = U_MISSING_RESOURCE_ERROR;
    }
    else {
      local_c0.p_ = 
      L"leap\xf473\xffff\xf47c\xffff\xf481\xffff\xf48a\xffff\xf495\xffff\xf49e\xffff\xf4a5\xffff\xf4ae\xffff\xf4b9\xffff\xf4c2\xffff慤⵹潦浲瑡攭捸灥⵴慮牲睯搀祡渭牡潲w慤⵹瑳湡慤潬敮攭捸灥⵴慮牲睯攀慲愭扢r牥ⵡ慮敭攀慲渭牡潲w敭慴潺敮氭湯g敭慴潺敮猭潨瑲洀湯桴昭牯慭⵴硥散瑰渭牡潲w潭瑮⵨慮牲睯洀湯桴猭慴摮污湯ⵥ硥散瑰渭牡潲w㙎捩彵㌶㐱潌慣敬慃档䭥祥义当㌲桓牡摥慄整潆浲瑡祓扭汯䕳䕅一椶畣㙟㠳慃档䭥祥义当㌲桓牡摥慄整潆浲瑡祓扭汯䕳䕅"
      ;
      UnicodeString::UnicodeString(&leapLabel,'\0',&local_c0,4);
      local_b8 = local_c0.p_;
      src = (UnicodeString *)Hashtable::get(this,&leapLabel);
      if (src == (UnicodeString *)0x0) {
        UnicodeString::setToBogus(field + (uint)index);
      }
      else {
        UnicodeString::fastCopyFrom(field + (uint)index,src);
      }
      UnicodeString::~UnicodeString(&leapLabel);
    }
    UnicodeString::~UnicodeString(&pathUString);
  }
  return;
}

Assistant:

static void
initLeapMonthPattern(UnicodeString *field, int32_t index, CalendarDataSink &sink, CharString &path, UErrorCode &status) {
    field[index].remove();
    if (U_SUCCESS(status)) {
        UnicodeString pathUString(path.data(), -1, US_INV);
        Hashtable *leapMonthTable = static_cast<Hashtable*>(sink.maps.get(pathUString));
        if (leapMonthTable != NULL) {
            UnicodeString leapLabel(FALSE, kLeapTagUChar, UPRV_LENGTHOF(kLeapTagUChar));
            UnicodeString *leapMonthPattern = static_cast<UnicodeString*>(leapMonthTable->get(leapLabel));
            if (leapMonthPattern != NULL) {
                field[index].fastCopyFrom(*leapMonthPattern);
            } else {
                field[index].setToBogus();
            }
            return;
        }
        status = U_MISSING_RESOURCE_ERROR;
    }
}